

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int *nr,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *val,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *stab,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  int i;
  int i_00;
  DataKey DVar2;
  long lVar3;
  ulong uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  long in_FS_OFFSET;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar7 = 0;
  ::soplex::infinity::__tls_init();
  best.m_backend.fpclass = cpp_dec_float_finite;
  best.m_backend.prec_elem = 0x1c;
  best.m_backend.data._M_elems[0] = 0;
  best.m_backend.data._M_elems[1] = 0;
  best.m_backend.data._M_elems[2] = 0;
  best.m_backend.data._M_elems[3] = 0;
  best.m_backend.data._M_elems[4] = 0;
  best.m_backend.data._M_elems[5] = 0;
  best.m_backend.data._M_elems[6] = 0;
  best.m_backend.data._M_elems[7] = 0;
  best.m_backend.data._M_elems[8] = 0;
  best.m_backend.data._M_elems[9] = 0;
  best.m_backend.data._M_elems[10] = 0;
  best.m_backend.data._M_elems[0xb] = 0;
  best.m_backend.data._M_elems[0xc] = 0;
  best.m_backend.data._M_elems[0xd] = 0;
  best.m_backend.data._M_elems[0xe] = 0;
  best.m_backend.data._M_elems[0xf] = 0;
  best.m_backend.data._M_elems[0x10] = 0;
  best.m_backend.data._M_elems[0x11] = 0;
  best.m_backend.data._M_elems[0x12] = 0;
  best.m_backend.data._M_elems[0x13] = 0;
  best.m_backend.data._M_elems[0x14] = 0;
  best.m_backend.data._M_elems[0x15] = 0;
  best.m_backend.data._M_elems[0x16] = 0;
  best.m_backend.data._M_elems[0x17] = 0;
  best.m_backend.data._M_elems[0x18] = 0;
  best.m_backend.data._M_elems[0x19] = 0;
  best.m_backend.data._M_elems._104_5_ = 0;
  best.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  best.m_backend.exp = 0;
  best.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&best,-*(double *)(in_FS_OFFSET + -8));
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)bestDelta,0.0);
  this->iscoid = true;
  pnVar5 = max;
  pnVar6 = &local_b0;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (max->m_backend).exp;
  local_b0.m_backend.neg = (max->m_backend).neg;
  local_b0.m_backend.fpclass = (max->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i = maxSelect(this,val,stab,&best,bestDelta,&local_b0,pSVar1->theCoPvec,pSVar1->theCoLbound,
                pSVar1->theCoUbound,0,1);
  this->iscoid = false;
  pnVar5 = max;
  pnVar6 = &local_130;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = (max->m_backend).exp;
  local_130.m_backend.neg = (max->m_backend).neg;
  local_130.m_backend.fpclass = (max->m_backend).fpclass;
  local_130.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i_00 = maxSelect(this,val,stab,&best,bestDelta,&local_130,pSVar1->thePvec,pSVar1->theLbound,
                   pSVar1->theUbound,0,1);
  if (i_00 < 0) {
    uVar4 = 0xffffffff00000000;
    if (i < 0) {
      *nr = -1;
      DVar2.info = 0;
      DVar2.idx = 0;
      goto LAB_005cd9fe;
    }
    *nr = i;
    DVar2 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,i);
  }
  else {
    *nr = i_00;
    DVar2 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,i_00);
  }
  uVar4 = (ulong)DVar2 & 0xffffffff00000000;
LAB_005cd9fe:
  return (SPxId)((ulong)DVar2 & 0xffffffff | uVar4);
}

Assistant:

SPxId SPxFastRT<R>::maxSelect(
   int& nr,
   R& val,
   R& stab,
   R& bestDelta,
   R max
)
{
   int indp, indc;
   R best = R(-infinity);
   bestDelta = 0.0;
   iscoid = true;
   indc = maxSelect(val, stab, best, bestDelta, max,
                    this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   indp = maxSelect(val, stab, best, bestDelta, max,
                    this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}